

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::build_extended_vector_type
          (CompilerMSL *this,uint32_t type_id,uint32_t components,BaseType basetype)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t id;
  SPIRType *args;
  SPIRType *pSVar3;
  ParsedIR *this_00;
  
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  uVar2 = ParsedIR::increase_bound_by(this_00,1);
  args = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr + type_id);
  pSVar3 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>((Compiler *)this,uVar2,args);
  pSVar3->vecsize = components;
  if (basetype != Unknown) {
    *(BaseType *)&(pSVar3->super_IVariant).field_0xc = basetype;
  }
  (pSVar3->super_IVariant).self.id = uVar2;
  (pSVar3->parent_type).id = type_id;
  (pSVar3->array).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar3->array_size_literal).super_VectorView<bool>.buffer_size = 0;
  pSVar3->pointer = false;
  bVar1 = Compiler::is_array((Compiler *)this,args);
  id = uVar2;
  if (bVar1) {
    id = ParsedIR::increase_bound_by(this_00,1);
    pSVar3 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>((Compiler *)this,id,pSVar3)
    ;
    (pSVar3->parent_type).id = uVar2;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar3->array,&args->array);
    SmallVector<bool,_8UL>::operator=(&pSVar3->array_size_literal,&args->array_size_literal);
  }
  uVar2 = id;
  if (args->pointer == true) {
    uVar2 = ParsedIR::increase_bound_by(this_00,1);
    pSVar3 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                       ((Compiler *)this,uVar2,pSVar3);
    (pSVar3->super_IVariant).self.id = id;
    (pSVar3->parent_type).id = id;
    pSVar3->storage = args->storage;
    pSVar3->pointer = true;
  }
  return uVar2;
}

Assistant:

uint32_t CompilerMSL::build_extended_vector_type(uint32_t type_id, uint32_t components, SPIRType::BaseType basetype)
{
	uint32_t new_type_id = ir.increase_bound_by(1);
	auto &old_type = get<SPIRType>(type_id);
	auto *type = &set<SPIRType>(new_type_id, old_type);
	type->vecsize = components;
	if (basetype != SPIRType::Unknown)
		type->basetype = basetype;
	type->self = new_type_id;
	type->parent_type = type_id;
	type->array.clear();
	type->array_size_literal.clear();
	type->pointer = false;

	if (is_array(old_type))
	{
		uint32_t array_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(array_type_id, *type);
		type->parent_type = new_type_id;
		type->array = old_type.array;
		type->array_size_literal = old_type.array_size_literal;
		new_type_id = array_type_id;
	}

	if (old_type.pointer)
	{
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(ptr_type_id, *type);
		type->self = new_type_id;
		type->parent_type = new_type_id;
		type->storage = old_type.storage;
		type->pointer = true;
		new_type_id = ptr_type_id;
	}

	return new_type_id;
}